

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O0

int32 bio_fread_3d(void ****arr,size_t e_sz,uint32 *d1,uint32 *d2,uint32 *d3,FILE *fp,uint32 swap,
                  uint32 *chksum)

{
  int32 iVar1;
  void *pvVar2;
  size_t ret;
  void *raw;
  uint32 n;
  uint32 l_d3;
  uint32 l_d2;
  uint32 l_d1;
  FILE *fp_local;
  uint32 *d3_local;
  uint32 *d2_local;
  uint32 *d1_local;
  size_t e_sz_local;
  void ****arr_local;
  
  _l_d2 = fp;
  fp_local = (FILE *)d3;
  d3_local = d2;
  d2_local = d1;
  d1_local = (uint32 *)e_sz;
  e_sz_local = (size_t)arr;
  iVar1 = bio_fread(&l_d3,4,1,fp,swap,chksum);
  if (iVar1 == 1) {
    iVar1 = bio_fread(&n,4,1,_l_d2,swap,chksum);
    if (iVar1 == 1) {
      iVar1 = bio_fread((void *)((long)&raw + 4),4,1,_l_d2,swap,chksum);
      if (iVar1 == 1) {
        iVar1 = bio_fread_1d((void **)&ret,(size_t)d1_local,(uint32 *)&raw,_l_d2,swap,chksum);
        if (iVar1 == (int)raw) {
          if ((int)raw != l_d3 * n * raw._4_4_) {
            __assert_fail("n == l_d1 * l_d2 * l_d3",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/bio.c"
                          ,0x1e1,
                          "int32 bio_fread_3d(void ****, size_t, uint32 *, uint32 *, uint32 *, FILE *, uint32, uint32 *)"
                         );
          }
          pvVar2 = __ckd_alloc_3d_ptr((ulong)l_d3,(ulong)n,(ulong)raw._4_4_,(void *)ret,
                                      (size_t)d1_local,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/bio.c"
                                      ,0x1e3);
          *(void **)e_sz_local = pvVar2;
          *d2_local = l_d3;
          *d3_local = n;
          fp_local->_flags = raw._4_4_;
          arr_local._4_4_ = (int)raw;
        }
        else {
          arr_local._4_4_ = -1;
        }
      }
      else {
        if (iVar1 == 0) {
          err_msg_system(ERR_ERROR,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/bio.c"
                         ,0x1d5,"Unable to read complete data");
        }
        else {
          err_msg_system(ERR_ERROR,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/bio.c"
                         ,0x1d8,"OS error in bio_fread_3d");
        }
        arr_local._4_4_ = -1;
      }
    }
    else {
      if (iVar1 == 0) {
        err_msg_system(ERR_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/bio.c"
                       ,0x1cb,"Unable to read complete data");
      }
      else {
        err_msg_system(ERR_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/bio.c"
                       ,0x1ce,"OS error in bio_fread_3d");
      }
      arr_local._4_4_ = -1;
    }
  }
  else {
    if (iVar1 == 0) {
      err_msg_system(ERR_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/bio.c"
                     ,0x1c1,"Unable to read complete data");
    }
    else {
      err_msg_system(ERR_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/bio.c"
                     ,0x1c4,"OS error in bio_fread_3d");
    }
    arr_local._4_4_ = -1;
  }
  return arr_local._4_4_;
}

Assistant:

int32
bio_fread_3d(void ****arr,
             size_t e_sz,
             uint32 *d1,
             uint32 *d2,
             uint32 *d3,
             FILE *fp,
             uint32 swap,
             uint32 *chksum)
{
    uint32 l_d1;
    uint32 l_d2;
    uint32 l_d3;
    uint32 n;
    void *raw;
    size_t ret;

    ret = bio_fread(&l_d1, sizeof(uint32), 1, fp, swap, chksum);
    if (ret != 1) {
	if (ret == 0) {
	    E_ERROR_SYSTEM("Unable to read complete data");
	}
	else {
	    E_ERROR_SYSTEM("OS error in bio_fread_3d");
	}
	return -1;
    }
    ret = bio_fread(&l_d2, sizeof(uint32), 1, fp, swap, chksum);
    if (ret != 1) {
	if (ret == 0) {
	    E_ERROR_SYSTEM("Unable to read complete data");
	}
	else {
	    E_ERROR_SYSTEM("OS error in bio_fread_3d");
	}
	return -1;
    }
    ret = bio_fread(&l_d3, sizeof(uint32), 1, fp, swap, chksum);
    if (ret != 1) {
	if (ret == 0) {
	    E_ERROR_SYSTEM("Unable to read complete data");
	}
	else {
	    E_ERROR_SYSTEM("OS error in bio_fread_3d");
	}
	return -1;
    }

    if (bio_fread_1d(&raw, e_sz, &n, fp, swap, chksum) != n) {
	return -1;
    }

    assert(n == l_d1 * l_d2 * l_d3);

    *arr = ckd_alloc_3d_ptr(l_d1, l_d2, l_d3, raw, e_sz);
    *d1 = l_d1;
    *d2 = l_d2;
    *d3 = l_d3;
    
    return n;
}